

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree_test.cpp
# Opt level: O0

int main(void)

{
  Status SVar1;
  ConcurrentStack<Door_*> *o;
  ostream *poVar2;
  pointer *local_a58;
  Node **local_a40;
  Node **local_9a0;
  pointer *local_980;
  Node *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  initializer_list<BehaviourTree::Node_*> local_960;
  Node *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  Status *local_938;
  Door ***local_930;
  initializer_list<BehaviourTree::Node_*> local_928;
  Node *local_918;
  Node **local_910;
  initializer_list<BehaviourTree::Node_*> local_908;
  Node *local_8f8;
  undefined1 *local_8f0;
  Node **local_8e8;
  initializer_list<BehaviourTree::Node_*> local_8e0;
  allocator local_8c9;
  string local_8c8 [32];
  undefined1 local_8a8 [8];
  DoorAction closeDoor;
  string local_848 [32];
  undefined1 local_828 [8];
  DoorAction walkThroughDoor;
  string local_7c8 [32];
  undefined1 local_7a8 [8];
  DoorAction smashDoor;
  string local_748 [32];
  undefined1 local_728 [8];
  DoorAction unlockDoor;
  string local_6c8 [32];
  undefined1 local_6a8 [8];
  DoorAction openDoor;
  string local_648 [32];
  undefined1 local_628 [8];
  DoorAction walkToDoor;
  microseconds local_5c8;
  undefined1 local_5c0 [8];
  Async async;
  IsNull<Door> isNull;
  SetVar<Door> setVariable;
  Pop<Door> popFromStack;
  GetStack<Door> getDoorStackFromBuilding;
  string local_450 [32];
  undefined1 local_430 [8];
  RepeatUntil untilFail;
  Succeed succeeder;
  Invert inverter [2];
  undefined1 local_340 [8];
  Select selector;
  Sequence sequence [3];
  undefined1 local_208 [8];
  Building building;
  DataContext data;
  BT behaviorTree;
  
  srand(0x2a);
  BehaviourTree::BehaviourTree((BehaviourTree *)&data.usedDoor);
  DataContext::DataContext((DataContext *)&building.doors.field_0xe8);
  Building::Building((Building *)local_208,5);
  local_980 = &selector.super_CompositeNode.children.
               super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    BehaviourTree::Sequence::Sequence((Sequence *)local_980);
    local_980 = local_980 + 9;
  } while (local_980 !=
           &sequence[2].super_CompositeNode.children.
            super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  BehaviourTree::Select::Select((Select *)local_340);
  local_9a0 = &succeeder.super_DecoratorNode.child;
  do {
    BehaviourTree::Invert::Invert((Invert *)local_9a0);
    local_9a0 = local_9a0 + 7;
  } while (local_9a0 != &inverter[1].super_DecoratorNode.child);
  BehaviourTree::Succeed::Succeed((Succeed *)&untilFail._exitStatus);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_450,"",(allocator *)((long)&getDoorStackFromBuilding.object + 7));
  BehaviourTree::RepeatUntil::RepeatUntil((RepeatUntil *)local_430,(string *)local_450,FAILURE);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&getDoorStackFromBuilding.object + 7));
  o = Building::getDoors((Building *)local_208);
  BehaviourTree::GetStack<Door>::GetStack
            ((GetStack<Door> *)&popFromStack.item,
             (ConcurrentStack<Door_*> *)&building.doors.field_0xe8,o,(Door *)0x0);
  BehaviourTree::Pop<Door>::Pop
            ((Pop<Door> *)&setVariable.object,(Door **)&data.doors.field_0xe8,
             (ConcurrentStack<Door_*> *)&building.doors.field_0xe8);
  BehaviourTree::SetVar<Door>::SetVar
            ((SetVar<Door> *)&isNull.object,&data.currentDoor,(Door **)&data.doors.field_0xe8);
  BehaviourTree::IsNull<Door>::IsNull((IsNull<Door> *)&async._statusPoolTime,&data.currentDoor);
  walkToDoor._84_4_ = 10;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&local_5c8,(int *)&walkToDoor.field_0x54);
  BehaviourTree::Async::Async((Async *)local_5c0,local_5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_648,"Walk to door",(allocator *)&openDoor.field_0x57);
  DoorAction::DoorAction((DoorAction *)local_628,(string *)local_648,99);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)&openDoor.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"Open door",(allocator *)&unlockDoor.field_0x57);
  DoorAction::DoorAction((DoorAction *)local_6a8,(string *)local_6c8,0xc);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&unlockDoor.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"Unlock door",(allocator *)&smashDoor.field_0x57);
  DoorAction::DoorAction((DoorAction *)local_728,(string *)local_748,0x19);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&smashDoor.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"Smash door",(allocator *)&walkThroughDoor.field_0x57);
  DoorAction::DoorAction((DoorAction *)local_7a8,(string *)local_7c8,0x3c);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&walkThroughDoor.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_848,"Walk through door",(allocator *)&closeDoor.field_0x57);
  DoorAction::DoorAction((DoorAction *)local_828,(string *)local_848,0x55);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator((allocator<char> *)&closeDoor.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c8,"Close door",&local_8c9);
  DoorAction::DoorAction((DoorAction *)local_8a8,(string *)local_8c8,100);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  BehaviourTree::setRootChild
            ((BehaviourTree *)&data.usedDoor,
             (Node *)&selector.super_CompositeNode.children.
                      super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_8f8 = (Node *)&popFromStack.item;
  local_8f0 = local_430;
  local_8e8 = &succeeder.super_DecoratorNode.child;
  local_8e0._M_array = &local_8f8;
  local_8e0._M_len = 3;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)
             &selector.super_CompositeNode.children.
              super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8e0);
  BehaviourTree::DecoratorNode::setChild
            ((DecoratorNode *)local_430,
             (Node *)&sequence[0].super_CompositeNode.children.
                      super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  BehaviourTree::DecoratorNode::setChild
            ((DecoratorNode *)&succeeder.super_DecoratorNode.child,(Node *)&async._statusPoolTime);
  local_918 = (Node *)&setVariable.object;
  local_910 = &inverter[0].super_DecoratorNode.child;
  local_908._M_array = &local_918;
  local_908._M_len = 2;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)
             &sequence[0].super_CompositeNode.children.
              super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_908);
  BehaviourTree::DecoratorNode::setChild
            ((DecoratorNode *)&inverter[0].super_DecoratorNode.child,(Node *)local_5c0);
  BehaviourTree::DecoratorNode::setChild
            ((DecoratorNode *)local_5c0,
             (Node *)&sequence[1].super_CompositeNode.children.
                      super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_950 = (Node *)local_628;
  local_948 = local_340;
  local_940 = local_828;
  local_938 = &untilFail._exitStatus;
  local_930 = &isNull.object;
  local_928._M_array = &local_950;
  local_928._M_len = 5;
  BehaviourTree::CompositeNode::addChildren
            ((CompositeNode *)
             &sequence[1].super_CompositeNode.children.
              super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_928);
  local_978 = (Node *)local_6a8;
  local_970 = local_728;
  local_968 = local_7a8;
  local_960._M_array = &local_978;
  local_960._M_len = 3;
  BehaviourTree::CompositeNode::addChildren((CompositeNode *)local_340,&local_960);
  BehaviourTree::DecoratorNode::setChild((DecoratorNode *)&untilFail._exitStatus,(Node *)local_8a8);
  SVar1 = BehaviourTree::run((BehaviourTree *)&data.usedDoor);
  if (SVar1 == SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Congratulations!  You made it into the building!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Sorry.  You have failed to enter the building.")
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  DoorAction::~DoorAction((DoorAction *)local_8a8);
  DoorAction::~DoorAction((DoorAction *)local_828);
  DoorAction::~DoorAction((DoorAction *)local_7a8);
  DoorAction::~DoorAction((DoorAction *)local_728);
  DoorAction::~DoorAction((DoorAction *)local_6a8);
  DoorAction::~DoorAction((DoorAction *)local_628);
  BehaviourTree::Async::~Async((Async *)local_5c0);
  BehaviourTree::IsNull<Door>::~IsNull((IsNull<Door> *)&async._statusPoolTime);
  BehaviourTree::SetVar<Door>::~SetVar((SetVar<Door> *)&isNull.object);
  BehaviourTree::Pop<Door>::~Pop((Pop<Door> *)&setVariable.object);
  BehaviourTree::GetStack<Door>::~GetStack((GetStack<Door> *)&popFromStack.item);
  BehaviourTree::RepeatUntil::~RepeatUntil((RepeatUntil *)local_430);
  BehaviourTree::Succeed::~Succeed((Succeed *)&untilFail._exitStatus);
  local_a40 = &inverter[1].super_DecoratorNode.child;
  do {
    local_a40 = local_a40 + -7;
    BehaviourTree::Invert::~Invert((Invert *)local_a40);
  } while (local_a40 != &succeeder.super_DecoratorNode.child);
  BehaviourTree::Select::~Select((Select *)local_340);
  local_a58 = &sequence[2].super_CompositeNode.children.
               super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_a58 = local_a58 + -9;
    BehaviourTree::Sequence::~Sequence((Sequence *)local_a58);
  } while (local_a58 !=
           &selector.super_CompositeNode.children.
            super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  Building::~Building((Building *)local_208);
  DataContext::~DataContext((DataContext *)&building.doors.field_0xe8);
  return 0;
}

Assistant:

int main() {
	std::srand(42);

	BT behaviorTree;
	DataContext data;

	Building building(5);  // Building with 5 doors to get in.
	BT::Sequence sequence[3];
	BT::Select selector;
	BT::Invert inverter[2];
	BT::Succeed succeeder;
	BT::RepeatUntil untilFail("", BT::Status::FAILURE);
	BT::GetStack<Door> getDoorStackFromBuilding(data.doors, building.getDoors());
	BT::Pop<Door> popFromStack(data.currentDoor, data.doors);
	BT::SetVar<Door> setVariable(data.usedDoor, data.currentDoor);
	BT::IsNull<Door> isNull(data.usedDoor);
	BT::Async async;

	// Probabilities of success
	DoorAction walkToDoor("Walk to door", 99), 
		openDoor("Open door", 12), 
		unlockDoor("Unlock door", 25), 
		smashDoor("Smash door", 60), 
		walkThroughDoor("Walk through door", 85), 
		closeDoor("Close door", 100);

	// Build the tree (last diagram of
	// http://www.gamasutra.com/blogs/ChrisSimpson/20140717/221339/Behavior_trees_for_AI_How_they_work.php )
	behaviorTree.setRootChild(&sequence[0]);
	sequence[0].addChildren({ &getDoorStackFromBuilding, &untilFail, &inverter[0] });
	untilFail.setChild(&sequence[1]);
	inverter[0].setChild(&isNull);
	sequence[1].addChildren({ &popFromStack, &inverter[1] });
	inverter[1].setChild(&async);
	async.setChild(&sequence[2]);
	sequence[2].addChildren({ &walkToDoor, &selector, &walkThroughDoor, &succeeder, &setVariable });
	selector.addChildren({ &openDoor, &unlockDoor, &smashDoor });
	succeeder.setChild(&closeDoor);

	if (behaviorTree.run() == BT::Status::SUCCESS)
		std::cout << "Congratulations!  You made it into the building!" << std::endl;
	else
		std::cout << "Sorry.  You have failed to enter the building." << std::endl;
}